

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

bool __thiscall
QGraphicsItem::collidesWithPath(QGraphicsItem *this,QPainterPath *path,ItemSelectionMode mode)

{
  ulong uVar1;
  double dVar2;
  undefined8 uVar3;
  char cVar4;
  undefined1 uVar5;
  long in_FS_OFFSET;
  double dVar6;
  QPainterPath thisShape;
  undefined1 local_78 [8];
  undefined1 local_70 [32];
  undefined8 uStack_50;
  undefined1 local_48 [24];
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = QPainterPath::isEmpty();
  if (cVar4 == '\0') {
    uStack_30._0_4_ = 0xffffffff;
    local_48._16_8_ = 0xffffffffffffffff;
    uStack_30._4_4_ = 0xffffffff;
    local_48._0_8_ = -NAN;
    local_48._8_8_ = -NAN;
    (*this->_vptr_QGraphicsItem[3])(local_48,this);
    dVar6 = uStack_30;
    dVar2 = (double)local_48._16_8_;
    if (((double)local_48._16_8_ == 0.0) && (!NAN((double)local_48._16_8_))) {
      local_48._0_8_ = (double)local_48._0_8_ + -1e-05;
      local_48._8_8_ = (double)local_48._8_8_ + 0.0;
      dVar2 = (double)local_48._16_8_ + 2e-05;
      dVar6 = uStack_30 + 0.0;
      uStack_30._0_4_ = SUB84(dVar6,0);
      local_48._16_8_ = dVar2;
      uStack_30._4_4_ = (int)((ulong)dVar6 >> 0x20);
    }
    if ((dVar6 == 0.0) && (!NAN(dVar6))) {
      local_48._0_8_ = (double)local_48._0_8_ + 0.0;
      local_48._8_8_ = (double)local_48._8_8_ + -1e-05;
      uStack_30 = dVar6 + 2e-05;
      local_48._16_8_ = dVar2;
    }
    uStack_50._0_4_ = 0xffffffff;
    local_70._24_8_ = 0xffffffffffffffff;
    uStack_50._4_4_ = 0xffffffff;
    local_70._8_8_ = -NAN;
    local_70._16_8_ = -NAN;
    QPainterPath::controlPointRect();
    dVar6 = uStack_50;
    dVar2 = (double)local_70._24_8_;
    if (((double)local_70._24_8_ == 0.0) && (!NAN((double)local_70._24_8_))) {
      local_70._8_8_ = (double)local_70._8_8_ + -1e-05;
      local_70._16_8_ = (double)local_70._16_8_ + 0.0;
      dVar2 = (double)local_70._24_8_ + 2e-05;
      dVar6 = uStack_50 + 0.0;
      uStack_50._0_4_ = SUB84(dVar6,0);
      local_70._24_8_ = dVar2;
      uStack_50._4_4_ = (int)((ulong)dVar6 >> 0x20);
    }
    if ((dVar6 == 0.0) && (!NAN(dVar6))) {
      local_70._8_8_ = (double)local_70._8_8_ + 0.0;
      local_70._16_8_ = (double)local_70._16_8_ + -1e-05;
      uStack_50 = dVar6 + 2e-05;
      local_70._24_8_ = dVar2;
    }
    cVar4 = QRectF::intersects((QRectF *)local_48);
    if (cVar4 != '\0') {
      local_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPainterPath::QPainterPath((QPainterPath *)local_70);
      if (mode < ContainsItemBoundingRect) {
        uVar1 = *(ulong *)&((this->d_ptr).d)->field_0x160;
        if ((uVar1 >> 0x1b & 1) == 0 && (uVar1 & 0x800020000) != 0) {
          clipPath((QGraphicsItem *)local_78);
        }
        else {
          (*this->_vptr_QGraphicsItem[4])(local_78,this);
        }
        uVar3 = local_70._0_8_;
        local_70._0_8_ = local_78;
        local_78 = (undefined1  [8])uVar3;
        QPainterPath::~QPainterPath((QPainterPath *)local_78);
      }
      else {
        QPainterPath::addRect((QRectF *)local_70);
      }
      QPainterPath::QPainterPath((QPainterPath *)local_78);
      cVar4 = QPainterPath::operator==((QPainterPath *)local_70,(QPainterPath *)local_78);
      QPainterPath::~QPainterPath((QPainterPath *)local_78);
      if (cVar4 == '\0') {
        if ((mode & ~ContainsItemBoundingRect) == IntersectsItemShape) {
          uVar5 = QPainterPath::intersects(path);
        }
        else {
          uVar5 = QPainterPath::contains(path);
        }
      }
      else {
        uVar5 = 0;
      }
      QPainterPath::~QPainterPath((QPainterPath *)local_70);
      goto LAB_005df402;
    }
  }
  uVar5 = 0;
LAB_005df402:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (bool)uVar5;
}

Assistant:

bool QGraphicsItem::collidesWithPath(const QPainterPath &path, Qt::ItemSelectionMode mode) const
{
    if (path.isEmpty()) {
        // No collision with empty paths.
        return false;
    }

    QRectF rectA(boundingRect());
    _q_adjustRect(&rectA);
    QRectF rectB(path.controlPointRect());
    _q_adjustRect(&rectB);
    if (!rectA.intersects(rectB)) {
        // This we can determine efficiently. If the two rects neither
        // intersect nor contain each other, then the two items do not collide.
        return false;
    }

    // For further testing, we need this item's shape or bounding rect.
    QPainterPath thisShape;
    if (mode == Qt::IntersectsItemShape || mode == Qt::ContainsItemShape)
        thisShape = (isClipped() && !d_ptr->localCollisionHack) ? clipPath() : shape();
    else
        thisShape.addRect(rectA);

    if (thisShape == QPainterPath()) {
        // Empty shape? No collision.
        return false;
    }

    // Use QPainterPath boolean operations to determine the collision, O(N*logN).
    if (mode == Qt::IntersectsItemShape || mode == Qt::IntersectsItemBoundingRect)
        return path.intersects(thisShape);
    return path.contains(thisShape);
}